

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

int envy_bios_parse_spreadspectrum(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t *res_01;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  envy_bios_spreadspectrum_entry *peVar11;
  ulong uVar12;
  char *__format;
  ulong uVar13;
  long lVar14;
  
  uVar2 = (bios->spreadspectrum).offset;
  if (uVar2 == 0) {
    return 0;
  }
  iVar3 = bios_u8(bios,(uint)uVar2,&(bios->spreadspectrum).version);
  res = &(bios->spreadspectrum).hlen;
  iVar4 = bios_u8(bios,(bios->spreadspectrum).offset + 1,res);
  res_00 = &(bios->spreadspectrum).entriesnum;
  iVar5 = bios_u8(bios,(bios->spreadspectrum).offset + 2,res_00);
  res_01 = &(bios->spreadspectrum).rlen;
  iVar6 = bios_u8(bios,(bios->spreadspectrum).offset + 3,res_01);
  if (iVar6 != 0 || (iVar5 != 0 || (iVar4 != 0 || iVar3 != 0))) {
    return -0xe;
  }
  envy_bios_block(bios,(uint)(bios->spreadspectrum).offset,
                  (uint)(bios->spreadspectrum).entriesnum * (uint)(bios->spreadspectrum).rlen +
                  (uint)(bios->spreadspectrum).hlen,"SPREADSPECTRUM",-1);
  bVar1 = (bios->spreadspectrum).version;
  if (bVar1 == 0x31) {
LAB_00253bc6:
    iVar3 = bios_u8(bios,(bios->spreadspectrum).offset + 4,&(bios->spreadspectrum).unk04);
    iVar4 = bios_u8(bios,(bios->spreadspectrum).offset + 5,&(bios->spreadspectrum).unk05);
    iVar5 = bios_u8(bios,(bios->spreadspectrum).offset + 6,&(bios->spreadspectrum).unk06);
    iVar6 = bios_u8(bios,(bios->spreadspectrum).offset + 7,&(bios->spreadspectrum).unk07);
    iVar7 = bios_u8(bios,(bios->spreadspectrum).offset + 8,&(bios->spreadspectrum).unk08);
    iVar8 = bios_u8(bios,(bios->spreadspectrum).offset + 9,&(bios->spreadspectrum).unk09);
    if (iVar8 != 0 || (iVar7 != 0 || ((iVar6 != 0 || iVar5 != 0) || (iVar4 != 0 || iVar3 != 0)))) {
      return -0xe;
    }
    uVar9 = 1;
    uVar13 = 10;
  }
  else {
    if (bVar1 != 0x41) {
      if (bVar1 != 0x40) {
        uVar12 = (ulong)(bVar1 >> 4);
        uVar13 = (ulong)(bVar1 & 0xf);
        __format = "Unknown SPREADSPECTRUM table version %d.%d\n";
        goto LAB_00253de6;
      }
      goto LAB_00253bc6;
    }
    uVar9 = 2 - ((bios->spreadspectrum).rlen < 2);
    iVar3 = bios_u8(bios,(bios->spreadspectrum).offset + 4,&(bios->spreadspectrum).unk04);
    if (iVar3 != 0) {
      return -0xe;
    }
    uVar13 = 5;
  }
  bVar1 = *res;
  uVar10 = (uint)bVar1;
  if ((uint)bVar1 < (uint)uVar13) {
    __format = "SPREADSPECTRUM table header too short [%d < %d]\n";
    uVar12 = (ulong)uVar10;
  }
  else {
    uVar12 = (ulong)*res_01;
    if (uVar9 <= *res_01) {
      if ((uint)uVar13 < uVar10) {
        fprintf(_stderr,"SPREADSPECTRUM table header longer than expected [%d > %d]\n",(ulong)uVar10
               );
        uVar12 = (ulong)*res_01;
      }
      if (uVar9 < (uint)uVar12) {
        fprintf(_stderr,"SPREADSPECTRUM table record longer than expected [%d > %d]\n",uVar12,
                (ulong)uVar9);
      }
      peVar11 = (envy_bios_spreadspectrum_entry *)calloc((ulong)(bios->spreadspectrum).entriesnum,4)
      ;
      (bios->spreadspectrum).entries = peVar11;
      if (peVar11 != (envy_bios_spreadspectrum_entry *)0x0) {
        lVar14 = 2;
        uVar13 = 0;
        do {
          if (*res_00 <= uVar13) {
            (bios->spreadspectrum).valid = '\x01';
            return 0;
          }
          peVar11 = (bios->spreadspectrum).entries;
          uVar9 = (uint)(bios->spreadspectrum).rlen * (int)uVar13 +
                  (uint)(bios->spreadspectrum).hlen + (uint)(bios->spreadspectrum).offset;
          *(short *)((long)peVar11 + lVar14 + -2) = (short)uVar9;
          uVar9 = bios_u8(bios,uVar9 & 0xffff,(uint8_t *)((long)&peVar11->offset + lVar14));
          if (1 < (bios->spreadspectrum).rlen) {
            uVar10 = bios_u8(bios,*(ushort *)((long)peVar11 + lVar14 + -2) + 1,
                             (uint8_t *)((long)&peVar11->offset + lVar14 + 1));
            uVar9 = uVar9 | uVar10;
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 4;
        } while (uVar9 == 0);
        return -0xe;
      }
      return -0xc;
    }
    __format = "SPREADSPECTRUM table record too short [%d < %d]\n";
    uVar13 = (ulong)uVar9;
  }
LAB_00253de6:
  fprintf(_stderr,__format,uVar12,uVar13);
  return -0x16;
}

Assistant:

int envy_bios_parse_spreadspectrum (struct envy_bios *bios) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, spreadspectrum->offset, &spreadspectrum->version);
	err |= bios_u8(bios, spreadspectrum->offset+1, &spreadspectrum->hlen);
	err |= bios_u8(bios, spreadspectrum->offset+2, &spreadspectrum->entriesnum);
	err |= bios_u8(bios, spreadspectrum->offset+3, &spreadspectrum->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, spreadspectrum->offset, spreadspectrum->hlen + spreadspectrum->rlen * spreadspectrum->entriesnum, "SPREADSPECTRUM", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (spreadspectrum->version) {
		case 0x31:
		case 0x40:
			wanthlen = 10;
			wantrlen = 1;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			err |= bios_u8(bios, spreadspectrum->offset+5, &spreadspectrum->unk05);
			err |= bios_u8(bios, spreadspectrum->offset+6, &spreadspectrum->unk06);
			err |= bios_u8(bios, spreadspectrum->offset+7, &spreadspectrum->unk07);
			err |= bios_u8(bios, spreadspectrum->offset+8, &spreadspectrum->unk08);
			err |= bios_u8(bios, spreadspectrum->offset+9, &spreadspectrum->unk09);
			if (err)
				return -EFAULT;
			break;
		case 0x41:
			wanthlen = 5;
			wantrlen = 1;
			if (spreadspectrum->rlen >= 2)
				wantrlen = 2;
			err |= bios_u8(bios, spreadspectrum->offset+4, &spreadspectrum->unk04);
			if (err)
				return -EFAULT;
			break;
		default:
			ENVY_BIOS_ERR("Unknown SPREADSPECTRUM table version %d.%d\n", spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
			return -EINVAL;
	}
	if (spreadspectrum->hlen < wanthlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table header too short [%d < %d]\n", spreadspectrum->hlen, wanthlen);
		return -EINVAL;
	}
	if (spreadspectrum->rlen < wantrlen) {
		ENVY_BIOS_ERR("SPREADSPECTRUM table record too short [%d < %d]\n", spreadspectrum->rlen, wantrlen);
		return -EINVAL;
	}
	if (spreadspectrum->hlen > wanthlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table header longer than expected [%d > %d]\n", spreadspectrum->hlen, wanthlen);
	}
	if (spreadspectrum->rlen > wantrlen) {
		ENVY_BIOS_WARN("SPREADSPECTRUM table record longer than expected [%d > %d]\n", spreadspectrum->rlen, wantrlen);
	}
	spreadspectrum->entries = calloc(spreadspectrum->entriesnum, sizeof *spreadspectrum->entries);
	if (!spreadspectrum->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		entry->offset = spreadspectrum->offset + spreadspectrum->hlen + spreadspectrum->rlen * i;
		err |= bios_u8(bios, entry->offset+0, &entry->unk00);
		if (spreadspectrum->rlen >= 2)
			err |= bios_u8(bios, entry->offset+1, &entry->unk01);
		if (err)
			return -EFAULT;
	}
	spreadspectrum->valid = 1;
	return 0;
}